

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_panel.cxx
# Opt level: O0

Fl_Double_Window * make_shell_window(void)

{
  Fl_Double_Window *pFVar1;
  Fl_Widget *pFVar2;
  Fl_Button *pFVar3;
  Fl_Text_Display *this;
  Fl_Group *this_00;
  Fl_Text_Buffer *this_01;
  Fl_Button *o_1;
  Fl_Return_Button *o;
  int local_420;
  int b_2;
  int b_1;
  int b;
  char buf [1024];
  
  pFVar1 = (Fl_Double_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window(pFVar1,0x16d,0x7d,"Shell Command");
  shell_window = pFVar1;
  pFVar2 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar2,10,0x1b,0x15b,0x19,"Command:");
  shell_command_input = (Fl_Input *)pFVar2;
  Fl_Widget::labelfont(pFVar2,1);
  Fl_Widget::callback((Fl_Widget *)shell_command_input,cb_shell_command_input);
  Fl_Widget::align((Fl_Widget *)shell_command_input,5);
  Fl_Preferences::get(&fluid_prefs,"shell_command",(char *)&b_1,"",0x400);
  Fl_Input_::value(&shell_command_input->super_Fl_Input_,(char *)&b_1);
  pFVar3 = (Fl_Button *)operator_new(0x80);
  Fl_Check_Button::Fl_Check_Button((Fl_Check_Button *)pFVar3,0x80,0x3d,0x5d,0x13,"Write Code");
  shell_writecode_button = (Fl_Check_Button *)pFVar3;
  Fl_Button::down_box(pFVar3,FL_DOWN_BOX);
  Fl_Widget::callback((Fl_Widget *)shell_writecode_button,cb_shell_writecode_button);
  Fl_Preferences::get(&fluid_prefs,"shell_writecode",&b_2,1);
  Fl_Button::value((Fl_Button *)shell_writecode_button,b_2);
  pFVar3 = (Fl_Button *)operator_new(0x80);
  Fl_Check_Button::Fl_Check_Button((Fl_Check_Button *)pFVar3,0xe7,0x3d,0x7e,0x13,"Write Messages");
  shell_writemsgs_button = (Fl_Check_Button *)pFVar3;
  Fl_Button::down_box(pFVar3,FL_DOWN_BOX);
  Fl_Widget::callback((Fl_Widget *)shell_writemsgs_button,cb_shell_writemsgs_button);
  Fl_Preferences::get(&fluid_prefs,"shell_writemsgs",&local_420,0);
  Fl_Button::value((Fl_Button *)shell_writemsgs_button,local_420);
  pFVar3 = (Fl_Button *)operator_new(0x80);
  Fl_Check_Button::Fl_Check_Button((Fl_Check_Button *)pFVar3,10,0x3e,0x6c,0x13,"Save .FL File");
  shell_savefl_button = (Fl_Check_Button *)pFVar3;
  Fl_Button::down_box(pFVar3,FL_DOWN_BOX);
  Fl_Widget::callback((Fl_Widget *)shell_savefl_button,cb_shell_savefl_button);
  Fl_Preferences::get(&fluid_prefs,"shell_savefl",(int *)((long)&o + 4),1);
  Fl_Button::value((Fl_Button *)shell_savefl_button,o._4_4_);
  pFVar2 = (Fl_Widget *)operator_new(0x80);
  Fl_Return_Button::Fl_Return_Button((Fl_Return_Button *)pFVar2,0x84,0x5a,0x8f,0x19,"Run Command");
  Fl_Widget::callback(pFVar2,do_shell_command);
  pFVar3 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar3,0x11d,0x5a,0x48,0x19,"Cancel");
  Fl_Widget::callback((Fl_Widget *)pFVar3,cb_Cancel);
  Fl_Group::end((Fl_Group *)shell_window);
  pFVar1 = (Fl_Double_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window(pFVar1,0x22b,0x1ae,"Shell Command Output");
  shell_run_window = pFVar1;
  this = (Fl_Text_Display *)operator_new(0x1a8);
  Fl_Text_Display::Fl_Text_Display(this,10,10,0x217,0x177,(char *)0x0);
  shell_run_display = this;
  Fl_Widget::box((Fl_Widget *)this,FL_DOWN_BOX);
  Fl_Text_Display::textfont(shell_run_display,4);
  this_00 = Fl_Group::current();
  Fl_Group::resizable(this_00,(Fl_Widget *)shell_run_display);
  this_01 = (Fl_Text_Buffer *)operator_new(0x88);
  Fl_Text_Buffer::Fl_Text_Buffer(this_01,0,0x400);
  shell_run_buffer = this_01;
  Fl_Text_Display::buffer(shell_run_display,this_01);
  pFVar2 = (Fl_Widget *)operator_new(0x80);
  Fl_Return_Button::Fl_Return_Button((Fl_Return_Button *)pFVar2,0x1d4,0x18b,0x4d,0x19,"Close");
  shell_run_button = (Fl_Return_Button *)pFVar2;
  Fl_Widget::callback(pFVar2,cb_shell_run_button);
  Fl_Group::end((Fl_Group *)shell_run_window);
  return shell_run_window;
}

Assistant:

Fl_Double_Window* make_shell_window() {
  { shell_window = new Fl_Double_Window(365, 125, "Shell Command");
    { shell_command_input = new Fl_Input(10, 27, 347, 25, "Command:");
      shell_command_input->labelfont(1);
      shell_command_input->callback((Fl_Callback*)cb_shell_command_input);
      shell_command_input->align(Fl_Align(FL_ALIGN_TOP_LEFT));
      char buf[1024];
      fluid_prefs.get("shell_command", buf, "", sizeof(buf));
      shell_command_input->value(buf);
    } // Fl_Input* shell_command_input
    { shell_writecode_button = new Fl_Check_Button(128, 61, 93, 19, "Write Code");
      shell_writecode_button->down_box(FL_DOWN_BOX);
      shell_writecode_button->callback((Fl_Callback*)cb_shell_writecode_button);
      int b;
      fluid_prefs.get("shell_writecode", b, 1);
      shell_writecode_button->value(b);
    } // Fl_Check_Button* shell_writecode_button
    { shell_writemsgs_button = new Fl_Check_Button(231, 61, 126, 19, "Write Messages");
      shell_writemsgs_button->down_box(FL_DOWN_BOX);
      shell_writemsgs_button->callback((Fl_Callback*)cb_shell_writemsgs_button);
      int b;
      fluid_prefs.get("shell_writemsgs", b, 0);
      shell_writemsgs_button->value(b);
    } // Fl_Check_Button* shell_writemsgs_button
    { shell_savefl_button = new Fl_Check_Button(10, 62, 108, 19, "Save .FL File");
      shell_savefl_button->down_box(FL_DOWN_BOX);
      shell_savefl_button->callback((Fl_Callback*)cb_shell_savefl_button);
      int b;
      fluid_prefs.get("shell_savefl", b, 1);
      shell_savefl_button->value(b);
    } // Fl_Check_Button* shell_savefl_button
    { Fl_Return_Button* o = new Fl_Return_Button(132, 90, 143, 25, "Run Command");
      o->callback((Fl_Callback*)do_shell_command);
    } // Fl_Return_Button* o
    { Fl_Button* o = new Fl_Button(285, 90, 72, 25, "Cancel");
      o->callback((Fl_Callback*)cb_Cancel);
    } // Fl_Button* o
    shell_window->end();
  } // Fl_Double_Window* shell_window
  { shell_run_window = new Fl_Double_Window(555, 430, "Shell Command Output");
    { shell_run_display = new Fl_Text_Display(10, 10, 535, 375);
      shell_run_display->box(FL_DOWN_BOX);
      shell_run_display->textfont(4);
      Fl_Group::current()->resizable(shell_run_display);
      shell_run_buffer = new Fl_Text_Buffer();
      shell_run_display->buffer(shell_run_buffer);
    } // Fl_Text_Display* shell_run_display
    { shell_run_button = new Fl_Return_Button(468, 395, 77, 25, "Close");
      shell_run_button->callback((Fl_Callback*)cb_shell_run_button);
    } // Fl_Return_Button* shell_run_button
    shell_run_window->end();
  } // Fl_Double_Window* shell_run_window
  return shell_run_window;
}